

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extinfo.h
# Opt level: O0

void server::extserverinforeply(ucharbuf *req,ucharbuf *p)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  clientinfo **ppcVar4;
  int local_50;
  int local_4c;
  int i_2;
  int i_1;
  ucharbuf q;
  clientinfo *pcStack_28;
  int i;
  clientinfo *ci;
  int cn;
  int extcmd;
  ucharbuf *p_local;
  ucharbuf *req_local;
  
  iVar2 = getint(req);
  putint(p,-1);
  putint(p,0x69);
  if (iVar2 == 0) {
    putint(p,totalsecs);
  }
  else {
    if (iVar2 == 1) {
      iVar2 = getint(req);
      pcStack_28 = (clientinfo *)0x0;
      if (-1 < iVar2) {
        for (q._20_4_ = 0; uVar1 = q._20_4_,
            iVar3 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients),
            (int)uVar1 < iVar3; q._20_4_ = q._20_4_ + 1) {
          ppcVar4 = vector<server::clientinfo_*>::operator[]
                              ((vector<server::clientinfo_*> *)clients,q._20_4_);
          if ((*ppcVar4)->clientnum == iVar2) {
            ppcVar4 = vector<server::clientinfo_*>::operator[]
                                ((vector<server::clientinfo_*> *)clients,q._20_4_);
            pcStack_28 = *ppcVar4;
            break;
          }
        }
        if (pcStack_28 == (clientinfo *)0x0) {
          putint(p,1);
          sendserverinforeply(p);
          return;
        }
      }
      putint(p,0);
      _i_2 = p->buf;
      q.buf = *(uchar **)&p->len;
      q._8_8_ = *(undefined8 *)&p->flags;
      putint((ucharbuf *)&i_2,-10);
      if (pcStack_28 == (clientinfo *)0x0) {
        for (local_4c = 0;
            iVar2 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients),
            local_4c < iVar2; local_4c = local_4c + 1) {
          ppcVar4 = vector<server::clientinfo_*>::operator[]
                              ((vector<server::clientinfo_*> *)clients,local_4c);
          putint((ucharbuf *)&i_2,(*ppcVar4)->clientnum);
        }
      }
      else {
        putint((ucharbuf *)&i_2,pcStack_28->clientnum);
      }
      sendserverinforeply((ucharbuf *)&i_2);
      if (pcStack_28 != (clientinfo *)0x0) {
        extinfoplayer(p,pcStack_28);
        return;
      }
      for (local_50 = 0;
          iVar2 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients),
          local_50 < iVar2; local_50 = local_50 + 1) {
        ppcVar4 = vector<server::clientinfo_*>::operator[]
                            ((vector<server::clientinfo_*> *)clients,local_50);
        extinfoplayer(p,*ppcVar4);
      }
      return;
    }
    if (iVar2 == 2) {
      extinfoteams(p);
    }
    else {
      putint(p,1);
    }
  }
  sendserverinforeply(p);
  return;
}

Assistant:

void extserverinforeply(ucharbuf &req, ucharbuf &p)
    {
        int extcmd = getint(req); // extended commands  

        //Build a new packet
        putint(p, EXT_ACK); //send ack
        putint(p, EXT_VERSION); //send version of extended info

        switch(extcmd)
        {
            case EXT_UPTIME:
            {
                putint(p, totalsecs); //in seconds
                break;
            }

            case EXT_PLAYERSTATS:
            {
                int cn = getint(req); //a special player, -1 for all
                
                clientinfo *ci = NULL;
                if(cn >= 0)
                {
                    loopv(clients) if(clients[i]->clientnum == cn) { ci = clients[i]; break; }
                    if(!ci)
                    {
                        putint(p, EXT_ERROR); //client requested by id was not found
                        sendserverinforeply(p);
                        return;
                    }
                }

                putint(p, EXT_NO_ERROR); //so far no error can happen anymore
                
                ucharbuf q = p; //remember buffer position
                putint(q, EXT_PLAYERSTATS_RESP_IDS); //send player ids following
                if(ci) putint(q, ci->clientnum);
                else loopv(clients) putint(q, clients[i]->clientnum);
                sendserverinforeply(q);
            
                if(ci) extinfoplayer(p, ci);
                else loopv(clients) extinfoplayer(p, clients[i]);
                return;
            }

            case EXT_TEAMSCORE:
            {
                extinfoteams(p);
                break;
            }

            default:
            {
                putint(p, EXT_ERROR);
                break;
            }
        }
        sendserverinforeply(p);
    }